

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_sparse_old_read(archive_read *a,tar *tar,archive_entry_header_gnutar *header,
                           size_t *unconsumed)

{
  wchar_t wVar1;
  gnu_sparse *in_RCX;
  tar *in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  extended *ext;
  void *data;
  ssize_t bytes_read;
  size_t *in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  undefined4 local_30;
  wchar_t in_stack_ffffffffffffffd4;
  wchar_t local_4;
  
  wVar1 = gnu_sparse_old_parse(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd4);
  if (wVar1 == L'\0') {
    if (*(char *)((long)&in_RDX[1].entry_pathname_override.s + 2) == '\0') {
      local_4 = L'\0';
    }
    else {
      do {
        tar_flush_unconsumed(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffc0 =
             (archive_read *)
             __archive_read_ahead
                       (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                        (ssize_t *)0x276b7d);
        if (in_stack_ffffffffffffffd4 < L'\0') {
          return L'\xffffffe2';
        }
        if (CONCAT44(in_stack_ffffffffffffffd4,local_30) < 0x200) {
          archive_set_error(in_RDI,0x54,
                            "Truncated tar archive detected while reading sparse file data");
          return L'\xffffffe2';
        }
        in_RCX->offset[0] = '\0';
        in_RCX->offset[1] = '\x02';
        in_RCX->offset[2] = '\0';
        in_RCX->offset[3] = '\0';
        in_RCX->offset[4] = '\0';
        in_RCX->offset[5] = '\0';
        in_RCX->offset[6] = '\0';
        in_RCX->offset[7] = '\0';
        wVar1 = gnu_sparse_old_parse(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd4);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
      } while (*(char *)&in_stack_ffffffffffffffc0->bidders[5].data != '\0');
      if (in_RSI->bidders[1].data != (void *)0x0) {
        in_RSI->bidders[0].bid =
             *(_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr **)
              ((long)in_RSI->bidders[1].data + 8);
      }
      local_4 = L'\0';
    }
  }
  else {
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static int
gnu_sparse_old_read(struct archive_read *a, struct tar *tar,
    const struct archive_entry_header_gnutar *header, size_t *unconsumed)
{
	ssize_t bytes_read;
	const void *data;
	struct extended {
		struct gnu_sparse sparse[21];
		char	isextended[1];
		char	padding[7];
	};
	const struct extended *ext;

	if (gnu_sparse_old_parse(a, tar, header->sparse, 4) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	if (header->isextended[0] == 0)
		return (ARCHIVE_OK);

	do {
		tar_flush_unconsumed(a, unconsumed);
		data = __archive_read_ahead(a, 512, &bytes_read);
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (bytes_read < 512) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive "
			    "detected while reading sparse file data");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;
		ext = (const struct extended *)data;
		if (gnu_sparse_old_parse(a, tar, ext->sparse, 21) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} while (ext->isextended[0] != 0);
	if (tar->sparse_list != NULL)
		tar->entry_offset = tar->sparse_list->offset;
	return (ARCHIVE_OK);
}